

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

bool __thiscall Quest_Context::TalkedNPC(Quest_Context *this,char vendor_id)

{
  bool bVar1;
  allocator local_59;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_38;
  
  if ((this->quest->quest->info).disabled == false) {
    std::__cxx11::string::string((string *)&local_38,"talkedtonpc",&local_59);
    local_58._8_8_ = 0;
    local_58._1_7_ = 0;
    local_58._M_pod_data[0] = vendor_id;
    local_40 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/quest.cpp:1049:42)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/quest.cpp:1049:42)>
               ::_M_manager;
    bVar1 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_38,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Quest_Context::TalkedNPC(char vendor_id)
{
	if (this->quest->Disabled())
		return false;

	return this->TriggerRule("talkedtonpc", [vendor_id](const std::deque<util::variant>& args) { return int(args[0]) == vendor_id; });
}